

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Gia_ManBalance_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Bal_Man_t *p_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  uint uVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar11;
  int iVar12;
  int *piVar13;
  int i;
  ulong uVar14;
  int in_R8D;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint local_a4;
  ulong local_88;
  int local_74;
  uint local_40;
  
  if (pObj->Value != 0xffffffff) {
    return;
  }
  if (((int)(uint)*(undefined8 *)pObj < 0) ||
     (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                  ,0x370,"void Gia_ManBalance_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjIsMux(p,pObj);
  if (iVar1 != 0) {
    Gia_ManBalance_rec(pNew,p,pObj + -(*(ulong *)pObj & 0x1fffffff));
    Gia_ManBalance_rec(pNew,p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    pGVar6 = Gia_ObjFanin2(p,pObj);
    Gia_ManBalance_rec(pNew,p,pGVar6);
    pGVar6 = Gia_ObjFanin2(p,pObj);
    uVar2 = pGVar6->Value;
    iVar1 = Gia_ObjFaninC2(p,pObj);
    uVar2 = Abc_LitNotCond(uVar2,iVar1);
    iVar1 = Abc_LitNotCond(pObj[-(*(ulong *)pObj >> 0x20 & 0x1fffffff)].Value,
                           (uint)(*(ulong *)pObj >> 0x3d) & 1);
    iVar3 = Gia_ObjFanin0Copy(pObj);
    pGVar6 = (Gia_Obj_t *)(ulong)uVar2;
    uVar2 = Gia_ManHashMuxReal(pNew,uVar2,iVar1,iVar3);
    pObj->Value = uVar2;
    Bal_ManSetGateLevel((Bal_Man_t *)pNew->pData,pGVar6,uVar2);
    return;
  }
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar7 = Vec_IntAlloc(1000);
    p->vSuper = pVVar7;
  }
  else {
    p->vSuper->nSize = 0;
  }
  iVar1 = Gia_ObjIsXor(pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsAndReal(p,pObj);
    if (iVar1 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                    ,0x30f,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)
                 ((ulong)((uint)*(undefined8 *)pObj >> 0x1d & 1) ^
                 (ulong)(pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff))));
    pGVar6 = Gia_ObjChild1(pObj);
    Gia_ManSuperCollectAnd_rec(p,pGVar6);
    Vec_IntSort(p->vSuper,(int)pGVar6);
    pVVar7 = p->vSuper;
    iVar1 = -1;
    iVar3 = 0;
    for (iVar11 = 0; iVar11 < pVVar7->nSize; iVar11 = iVar11 + 1) {
      iVar4 = Vec_IntEntry(pVVar7,iVar11);
      if (iVar4 != 1) {
        iVar5 = extraout_EDX;
        if (iVar4 == 0) {
LAB_00561b64:
          Vec_IntFill(pVVar7,1,iVar5);
          goto LAB_00561b6f;
        }
        if (iVar1 != -1) {
          iVar5 = Abc_Lit2Var(iVar1);
          iVar12 = Abc_Lit2Var(iVar4);
          if (iVar5 == iVar12) {
            iVar5 = extraout_EDX_00;
            if (iVar1 == iVar4) goto LAB_00561b2c;
            goto LAB_00561b64;
          }
        }
        Vec_IntWriteEntry(pVVar7,iVar3,iVar4);
        iVar1 = iVar4;
        iVar3 = iVar3 + 1;
      }
LAB_00561b2c:
    }
    Vec_IntShrink(pVVar7,iVar3);
    if (pVVar7->nSize == 0) {
      Vec_IntPush(pVVar7,1);
    }
  }
  else {
    if ((*(ulong *)pObj & 0x2000000020000000) != 0) {
      __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                    ,0x2fc,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManSuperCollectXor_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
    pGVar6 = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
    Gia_ManSuperCollectXor_rec(p,pGVar6);
    Vec_IntSort(p->vSuper,(int)pGVar6);
    pVVar7 = p->vSuper;
    iVar1 = 0;
    iVar3 = -1;
    uVar2 = 0;
    for (iVar11 = 0; iVar11 < pVVar7->nSize; iVar11 = iVar11 + 1) {
      iVar4 = Vec_IntEntry(pVVar7,iVar11);
      if (iVar4 != 0) {
        if (iVar4 == 1) {
          uVar2 = uVar2 ^ 1;
        }
        else if (iVar3 == iVar4) {
          iVar1 = iVar1 + -1;
          iVar3 = -1;
        }
        else {
          Vec_IntWriteEntry(pVVar7,iVar1,iVar4);
          iVar1 = iVar1 + 1;
          iVar3 = iVar4;
        }
      }
    }
    Vec_IntShrink(pVVar7,iVar1);
    if (pVVar7->nSize == 0) {
      Vec_IntPush(pVVar7,uVar2);
    }
    else if (uVar2 != 0) {
      uVar2 = Vec_IntEntry(pVVar7,0);
      if ((int)uVar2 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf4,"int Abc_LitNot(int)");
      }
      Vec_IntWriteEntry(pVVar7,0,uVar2 ^ 1);
    }
  }
LAB_00561b6f:
  pVVar7 = p->vSuper;
  if (pVVar7->nSize < 1) {
    __assert_fail("Vec_IntSize(p->vSuper) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                  ,0x312,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
  }
  pVVar8 = p->vStore;
  if (pVVar8 == (Vec_Int_t *)0x0) {
    pVVar8 = Vec_IntAlloc(1000);
    p->vStore = pVVar8;
    pVVar7 = p->vSuper;
  }
  uVar2 = pVVar8->nSize;
  for (iVar1 = 0; iVar1 < pVVar7->nSize; iVar1 = iVar1 + 1) {
    iVar3 = Vec_IntEntry(pVVar7,iVar1);
    Vec_IntPush(pVVar8,iVar3);
  }
  iVar1 = p->vStore->nSize;
  uVar19 = (ulong)uVar2;
  while( true ) {
    pVVar7 = p->vStore;
    iVar3 = (int)uVar19;
    if (iVar1 <= iVar3) break;
    iVar11 = Vec_IntEntry(pVVar7,iVar3);
    iVar4 = Abc_Lit2Var(iVar11);
    pGVar6 = Gia_ManObj(p,iVar4);
    Gia_ManBalance_rec(pNew,p,pGVar6);
    pVVar7 = p->vStore;
    uVar17 = pGVar6->Value;
    iVar11 = Abc_LitIsCompl(iVar11);
    iVar11 = Abc_LitNotCond(uVar17,iVar11);
    Vec_IntWriteEntry(pVVar7,iVar3,iVar11);
    uVar19 = (ulong)(iVar3 + 1);
  }
  if (pVVar7->nSize != iVar1) {
    __assert_fail("Vec_IntSize(p->vStore) == iEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                  ,0x38b,"void Gia_ManBalance_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
  }
  if (((int)uVar2 < 0) || (uVar17 = iVar1 - uVar2, uVar17 == 0 || iVar1 < (int)uVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  pVVar8 = p->vSuper;
  piVar13 = pVVar7->pArray + uVar2;
  pVVar8->nSize = 0;
  if (uVar17 == 2) {
    Vec_IntPush(pVVar8,*piVar13);
    Vec_IntPush(pVVar8,piVar13[1]);
    iVar1 = Vec_IntPop(pVVar8);
    iVar3 = Vec_IntPop(pVVar8);
    iVar11 = Gia_ObjIsXor(pObj);
    if (iVar11 == 0) {
      uVar17 = Gia_ManHashAnd(pNew,iVar1,iVar3);
    }
    else if (pNew->pMuxes == (uint *)0x0) {
      uVar17 = Gia_ManHashXor(pNew,iVar1,iVar3);
    }
    else {
      uVar17 = Gia_ManHashXorReal(pNew,iVar1,iVar3);
    }
    pGVar6 = (Gia_Obj_t *)(ulong)uVar17;
    Vec_IntPush(pVVar8,uVar17);
    Bal_ManSetGateLevel((Bal_Man_t *)pNew->pData,pGVar6,uVar17);
    iVar1 = pVVar8->nSize;
    while (1 < iVar1) {
      iVar3 = Vec_IntEntry(pVVar8,iVar1 + -1);
      iVar12 = iVar1 + -2;
      iVar11 = Vec_IntEntry(pVVar8,iVar12);
      iVar4 = Abc_Lit2Var(iVar3);
      iVar4 = Gia_ObjLevelId(pNew,iVar4);
      iVar5 = Abc_Lit2Var(iVar11);
      iVar5 = Gia_ObjLevelId(pNew,iVar5);
      if (iVar4 <= iVar5) break;
      iVar1 = iVar1 + -1;
      Vec_IntWriteEntry(pVVar8,iVar1,iVar11);
      Vec_IntWriteEntry(pVVar8,iVar12,iVar3);
    }
LAB_00561caf:
    iVar1 = pVVar8->nSize;
  }
  else {
    if (uVar17 == 1) {
      Vec_IntPush(pVVar8,*piVar13);
      goto LAB_00561caf;
    }
    if ((int)uVar17 < 3) goto LAB_005622b3;
    p_00 = (Bal_Man_t *)pNew->pData;
    for (uVar19 = 0; uVar17 != uVar19; uVar19 = uVar19 + 1) {
      Vec_IntPush(pVVar8,piVar13[uVar19]);
    }
    pVVar7 = p_00->vCosts;
    uVar17 = pVVar8->nSize;
    uVar15 = 1;
    if (1 < (int)uVar17) {
      uVar15 = uVar17;
    }
    piVar13 = pVVar8->pArray;
    uVar9 = 1;
    for (uVar19 = 0; uVar19 != uVar15 - 1; uVar19 = uVar19 + 1) {
      uVar20 = uVar19 & 0xffffffff;
      uVar14 = uVar9;
      while( true ) {
        uVar18 = (uint)uVar20;
        if (uVar17 == uVar14) break;
        iVar1 = Abc_Lit2Var(piVar13[uVar14]);
        iVar1 = Vec_IntEntry(pVVar7,iVar1);
        iVar3 = Abc_Lit2Var(piVar13[(int)uVar18]);
        iVar3 = Vec_IntEntry(pVVar7,iVar3);
        uVar10 = (uint)uVar14;
        if (iVar1 <= iVar3) {
          uVar10 = uVar18;
        }
        uVar14 = uVar14 + 1;
        uVar20 = (ulong)uVar10;
      }
      iVar1 = piVar13[uVar19];
      piVar13[uVar19] = piVar13[(int)uVar18];
      piVar13[(int)uVar18] = iVar1;
      uVar9 = uVar9 + 1;
    }
LAB_00562130:
    iVar1 = pVVar8->nSize;
    if (1 < (long)iVar1) {
      piVar13 = pVVar8->pArray;
      iVar1 = Bal_LitDelay(p_00,piVar13[(long)iVar1 + -1]);
      uVar19 = (ulong)(uint)pVVar8->nSize;
      if (pVVar8->nSize < 2) {
        __assert_fail("Vec_IntSize(vSuper) > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                      ,0x24b,"int Vec_IntFindFirstSameDelayAsLast(Bal_Man_t *, Vec_Int_t *)");
      }
      do {
        uVar9 = uVar19;
        iVar3 = (int)uVar9;
        if (iVar3 < 2) {
          uVar19 = 0;
          uVar9 = 1;
          break;
        }
        iVar11 = Vec_IntEntry(pVVar8,iVar3 + -2);
        iVar11 = Bal_LitDelay(p_00,iVar11);
        if (iVar11 < iVar1) {
          __assert_fail("DelayCur >= Delay",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                        ,0x24f,"int Vec_IntFindFirstSameDelayAsLast(Bal_Man_t *, Vec_Int_t *)");
        }
        uVar19 = (ulong)(iVar3 - 1);
      } while (iVar11 <= iVar1);
      uVar17 = pVVar8->nSize;
      uVar14 = (ulong)uVar17;
      if ((int)uVar17 <= (int)uVar19) {
        __assert_fail("iBeg <= iEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                      ,0x268,"int Bal_ManFindBestPair(Bal_Man_t *, Vec_Int_t *, Gia_Obj_t *)");
      }
      uVar20 = (ulong)((int)uVar9 - 1);
      iVar1 = 1000000000;
      local_a4 = 0xffffffff;
      local_88 = 0xffffffff;
LAB_00561e89:
      if (0 < (long)uVar20) {
        uVar20 = uVar20 - 1;
        uVar16 = uVar14;
LAB_00561e9a:
        do {
          if ((long)uVar16 <= (long)uVar19) goto LAB_00561e89;
          iVar11 = Bal_ManEvalTwo(p_00,piVar13[uVar16 - 1],piVar13[uVar20],0,in_R8D);
          if (iVar11 != -1) {
            iVar4 = Bal_LitCost(p_00,piVar13[uVar20]);
            if (iVar11 == iVar4) {
              local_a4 = (int)uVar20 << 0x10 | (int)uVar16 - 1U;
              goto LAB_00561eff;
            }
            if (iVar11 < iVar1) {
              uVar16 = uVar16 - 1;
              local_a4 = (uint)uVar16;
              local_88 = uVar20 & 0xffffffff;
              iVar1 = iVar11;
              goto LAB_00561e9a;
            }
          }
          uVar16 = uVar16 - 1;
        } while( true );
      }
      if (iVar1 == 1000000000) {
LAB_0056200d:
        if (iVar3 < 2) {
          iVar3 = 1;
        }
        uVar15 = iVar3 << 0x10;
        local_74 = 1000000000;
        uVar19 = uVar9 - 1;
        while (uVar19 < uVar14) {
          uVar18 = uVar15;
          for (uVar20 = (ulong)(int)uVar9; (long)uVar20 < (long)uVar14; uVar20 = uVar20 + 1) {
            iVar1 = Bal_ManEvalTwo(p_00,piVar13[uVar19],piVar13[uVar20],0,in_R8D);
            if (iVar1 != -1) {
              iVar11 = Bal_LitCost(p_00,piVar13[uVar19]);
              iVar3 = Bal_LitCost(p_00,piVar13[uVar20]);
              if (iVar3 < iVar11) {
                iVar3 = iVar11;
              }
              local_40 = (uint)uVar19;
              if (iVar1 == iVar3) {
                local_a4 = uVar18 | local_40;
                goto LAB_00561eff;
              }
              if (iVar1 < local_74) {
                local_88 = uVar20 & 0xffffffff;
                local_a4 = local_40;
                local_74 = iVar1;
              }
            }
            uVar18 = uVar18 + 0x10000;
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          uVar15 = uVar15 + 0x10000;
          uVar19 = uVar19 + 1;
        }
        if (local_74 == 1000000000) {
          local_a4 = uVar17 - 2 | uVar17 * 0x10000 - 0x10000;
        }
        else {
          local_a4 = (int)local_88 << 0x10 | local_a4;
        }
      }
      else {
        iVar11 = Bal_LitDelay(p_00,piVar13[(int)local_88]);
        if (iVar1 >> 4 != iVar11) goto LAB_0056200d;
        local_a4 = (int)local_88 << 0x10 | local_a4;
      }
LAB_00561eff:
      uVar17 = Vec_IntEntry(pVVar8,(int)local_a4 >> 0x10);
      iVar1 = Vec_IntEntry(pVVar8,local_a4 & 0xffff);
      Vec_IntRemove(pVVar8,uVar17);
      Vec_IntRemove(pVVar8,iVar1);
      iVar3 = Gia_ObjIsXor(pObj);
      pGVar6 = (Gia_Obj_t *)(ulong)uVar17;
      if (iVar3 == 0) {
        iVar1 = Gia_ManHashAnd(pNew,uVar17,iVar1);
      }
      else {
        iVar1 = Gia_ManHashXorReal(pNew,uVar17,iVar1);
      }
      Bal_ManSetGateLevel(p_00,pGVar6,iVar1);
      pVVar7 = p_00->vCosts;
      Vec_IntPush(pVVar8,iVar1);
      piVar13 = pVVar8->pArray;
      for (uVar19 = (ulong)(uint)pVVar8->nSize; 1 < (int)uVar19; uVar19 = uVar19 - 1) {
        iVar1 = Abc_Lit2Var(piVar13[uVar19 - 1]);
        iVar1 = Vec_IntEntry(pVVar7,iVar1);
        iVar3 = Abc_Lit2Var(piVar13[uVar19 - 2]);
        iVar3 = Vec_IntEntry(pVVar7,iVar3);
        if (iVar1 <= iVar3) break;
        *(ulong *)(piVar13 + (uVar19 - 2)) =
             CONCAT44((int)*(undefined8 *)(piVar13 + (uVar19 - 2)),
                      (int)((ulong)*(undefined8 *)(piVar13 + (uVar19 - 2)) >> 0x20));
      }
      goto LAB_00562130;
    }
  }
  if (iVar1 == 1) {
    uVar17 = Vec_IntEntry(pVVar8,0);
    pObj->Value = uVar17;
    Vec_IntShrink(p->vStore,uVar2);
    return;
  }
LAB_005622b3:
  __assert_fail("Vec_IntSize(vSuper) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                ,0x35c,"int Gia_ManBalanceGate(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int *, int)");
}

Assistant:

void Gia_ManBalance_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, int fStrict )
{
    int i, iLit, iBeg, iEnd;
    if ( ~pObj->Value )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    assert( !Gia_ObjIsBuf(pObj) );
    // handle MUX
    if ( Gia_ObjIsMux(p, pObj) )
    {
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin0(pObj), fStrict );
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin1(pObj), fStrict );
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin2(p, pObj), fStrict );
        pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        Gia_ObjSetGateLevel( pNew, Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value)) );
        return;
    }
    // find supergate
    Gia_ManSuperCollect( p, pObj, fStrict );
    // save entries
    if ( p->vStore == NULL )
        p->vStore = Vec_IntAlloc( 1000 );
    iBeg = Vec_IntSize( p->vStore );
    Vec_IntAppend( p->vStore, p->vSuper );
    iEnd = Vec_IntSize( p->vStore );
    // call recursively
    Vec_IntForEachEntryStartStop( p->vStore, iLit, i, iBeg, iEnd )
    {
        Gia_Obj_t * pTemp = Gia_ManObj( p, Abc_Lit2Var(iLit) );
        Gia_ManBalance_rec( pNew, p, pTemp, fStrict );
        Vec_IntWriteEntry( p->vStore, i, Abc_LitNotCond(pTemp->Value, Abc_LitIsCompl(iLit)) );
    }
    assert( Vec_IntSize(p->vStore) == iEnd );
    // consider general case
    pObj->Value = Gia_ManBalanceGate( pNew, pObj, p->vSuper, Vec_IntEntryP(p->vStore, iBeg), iEnd-iBeg );
    Vec_IntShrink( p->vStore, iBeg );
}